

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar4;
  char *__format;
  int id;
  int len;
  long lVar3;
  
  len = (int)((ulong)in_RAX >> 0x20);
  clear(this);
  _id = (ulong)(uint)len << 0x20;
  iVar1 = (*dr->_vptr_DataReader[3])(dr,&id,4);
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (lVar3 == 4) {
    do {
      iVar1 = id;
      uVar4 = (ulong)id;
      if (uVar4 == 0xffffffffffffff17) {
        return 0;
      }
      if (id < -0x5b03) {
        uVar2 = -id - 0x5b04;
        _id = CONCAT44(len,uVar2);
        uVar4 = (ulong)uVar2;
        if ((uint)iVar1 < 0xffffa4dd) {
LAB_001448fd:
          fprintf(_stderr,"id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)",uVar4,
                  0x20);
          goto LAB_0014495b;
        }
        _id = (ulong)uVar2;
        iVar1 = (*dr->_vptr_DataReader[3])(dr,&len,4);
        lVar3 = CONCAT44(extraout_var_00,iVar1);
        if (lVar3 != 4) {
          __format = "ParamDict read array length failed %zd";
          goto LAB_00144951;
        }
        Mat::create(&this->d->params[id].v,len,4,(Allocator *)0x0);
        iVar1 = (*dr->_vptr_DataReader[3])(dr,this->d->params[id].v.data,(long)len << 2);
        lVar3 = CONCAT44(extraout_var_01,iVar1);
        if (lVar3 != (long)len * 4) {
          __format = "ParamDict read array element failed %zd";
          goto LAB_00144951;
        }
        this->d->params[id].type = 4;
      }
      else {
        if (0x1f < id) goto LAB_001448fd;
        iVar1 = (*dr->_vptr_DataReader[3])(dr,&this->d->params[uVar4].field_1,4);
        lVar3 = CONCAT44(extraout_var_02,iVar1);
        if (lVar3 != 4) {
          __format = "ParamDict read value failed %zd";
          goto LAB_00144951;
        }
        this->d->params[id].type = 1;
      }
      iVar1 = (*dr->_vptr_DataReader[3])(dr,&id,4);
      lVar3 = CONCAT44(extraout_var_03,iVar1);
    } while (lVar3 == 4);
    __format = "ParamDict read EOP failed %zd";
  }
  else {
    __format = "ParamDict read id failed %zd";
  }
LAB_00144951:
  fprintf(_stderr,__format,lVar3);
LAB_0014495b:
  fputc(10,_stderr);
  return -1;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

    //     binary 0
    //     binary 100
    //     binary 1
    //     binary 1.250000
    //     binary 3 | array_bit
    //     binary 5
    //     binary 0.1
    //     binary 0.2
    //     binary 0.4
    //     binary 0.8
    //     binary 1.0
    //     binary -233(EOP)

    int id = 0;
    size_t nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != sizeof(int))
    {
        NCNN_LOGE("ParamDict read id failed %zd", nread);
        return -1;
    }

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                NCNN_LOGE("ParamDict read array length failed %zd", nread);
                return -1;
            }

            d->params[id].v.create(len);

            float* ptr = d->params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != sizeof(float) * len)
            {
                NCNN_LOGE("ParamDict read array element failed %zd", nread);
                return -1;
            }

            d->params[id].type = 4;
        }
        else
        {
            nread = dr.read(&d->params[id].f, sizeof(float));
            if (nread != sizeof(float))
            {
                NCNN_LOGE("ParamDict read value failed %zd", nread);
                return -1;
            }

            d->params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != sizeof(int))
        {
            NCNN_LOGE("ParamDict read EOP failed %zd", nread);
            return -1;
        }
    }

    return 0;
}